

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

char * off_msg_str(obj *otmp,boolean delayed,boolean deliberate)

{
  char *pcVar1;
  char *local_20;
  boolean deliberate_local;
  boolean delayed_local;
  obj *otmp_local;
  
  if ((otmp == (obj *)0x0) || (flags.verbose == '\0')) {
    off_msg_str::buf[0] = '\0';
  }
  else {
    if (deliberate == '\0') {
      local_20 = "were wearing";
    }
    else {
      local_20 = "take off";
      if (delayed != '\0') {
        local_20 = "finish taking off";
      }
    }
    pcVar1 = doname(otmp);
    snprintf(off_msg_str::buf,0x100,"You %s %s.",local_20,pcVar1);
  }
  return off_msg_str::buf;
}

Assistant:

static const char *off_msg_str(const struct obj *otmp,
			       boolean delayed, boolean deliberate)
{
	static char buf[BUFSZ];

	if (otmp && flags.verbose) {
	    snprintf(buf, BUFSZ, "You %s %s.",
		     !deliberate ? "were wearing" :
		     delayed ? "finish taking off" : "take off",
		     doname(otmp));
	} else {
	    buf[0] = '\0';
	}

	return buf;
}